

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall gss::innards::Proof::start_adjacency_constraints_for(Proof *this,int p,int t)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)
                           &((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                            ->field_0x50,"* adjacency ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,p);
  poVar1 = std::operator<<(poVar1," maps to ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,t);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

auto Proof::start_adjacency_constraints_for(int p, int t) -> void
{
    _imp->model_stream << "* adjacency " << p << " maps to " << t << '\n';
}